

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O2

uint16_t ProtocolTCP::ComputeChecksum
                   (uint8_t *packet,uint16_t length,uint8_t *sourceIP,uint8_t *targetIP)

{
  uint32_t uVar1;
  uint16_t uVar2;
  uint uVar3;
  uint length_00;
  undefined6 in_register_00000032;
  
  uVar1 = FCS::ChecksumAdd(sourceIP,4,0);
  uVar1 = FCS::ChecksumAdd(targetIP,4,uVar1);
  uVar3 = (uint)CONCAT62(in_register_00000032,length);
  length_00 = uVar3;
  if ((length & 1) != 0) {
    packet[length] = '\0';
    length_00 = uVar3 + 1 & 0xffff;
  }
  uVar1 = FCS::ChecksumAdd(packet,length_00,uVar3 + uVar1 + 6);
  uVar2 = FCS::ChecksumComplete(uVar1);
  return uVar2;
}

Assistant:

uint16_t ProtocolTCP::ComputeChecksum(uint8_t* packet,
                                      uint16_t length,
                                      const uint8_t* sourceIP,
                                      const uint8_t* targetIP)
{
    uint32_t checksum;
    uint16_t tmp;

    // A whole lot o' hokum just to compute the checksum
    checksum = FCS::ChecksumAdd(sourceIP, 4, 0);
    checksum = FCS::ChecksumAdd(targetIP, 4, checksum);
    checksum += 0x06; // protocol
    checksum += length;
    if ((length & 0x0001) != 0)
    {
        // length is odd
        tmp = length + 1;
        packet[length] = 0;
    }
    else
    {
        tmp = length;
    }
    checksum = FCS::ChecksumAdd(packet, tmp, checksum);

    return FCS::ChecksumComplete(checksum);
}